

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O2

Mat6x6d * __thiscall
OpenMD::HydroProp::getDiffusionTensorAtPos
          (Mat6x6d *__return_storage_ptr__,HydroProp *this,Vector3d *pos,RealType temperature)

{
  Mat3x3d U;
  RectMatrix<double,_3U,_3U> local_5b8;
  RectMatrix<double,_3U,_3U> local_570;
  Mat3x3d Dtr;
  RectMatrix<double,_3U,_3U> local_4e0;
  Mat3x3d Dposrr;
  Mat3x3d Dpostr;
  Mat3x3d Dpostt;
  Vector<double,_3U> local_3c0;
  Vector3d cp;
  RectMatrix<double,_3U,_3U> local_390;
  SquareMatrix3<double> local_348;
  RectMatrix<double,_3U,_3U> local_300;
  SquareMatrix3<double> local_2b8;
  RectMatrix<double,_3U,_3U> local_270;
  RectMatrix<double,_3U,_3U> local_228;
  Mat3x3d Drr;
  Mat3x3d Dtt;
  Mat6x6d D;
  
  operator-((Vector<double,_3U> *)&D,&pos->super_Vector<double,_3U>,
            &(this->cor_).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&cp.super_Vector<double,_3U>,(Vector<double,_3U> *)&D);
  SquareMatrix<double,_3>::SquareMatrix(&U.super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&local_3c0,&cp.super_Vector<double,_3U>);
  SquareMatrix3<double>::setupSkewMat
            ((SquareMatrix3<double> *)&U.super_SquareMatrix<double,_3>,(Vector3<double> *)&local_3c0
            );
  getDiffusionTensor(&D,this,temperature);
  SquareMatrix<double,_3>::SquareMatrix(&Dtt.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Dtr.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Drr.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&D,0,0,
             (SquareMatrix3<double> *)&Dtt.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&D,3,0,
             (SquareMatrix3<double> *)&Dtr.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&D,3,3,
             (SquareMatrix3<double> *)&Drr.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Dpostt.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Dpostr.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Dposrr.super_SquareMatrix<double,_3>);
  operator*(&local_2b8,(SquareMatrix3<double> *)&U.super_SquareMatrix<double,_3>,
            (SquareMatrix3<double> *)&Drr.super_SquareMatrix<double,_3>);
  operator*((SquareMatrix3<double> *)&local_270,&local_2b8,&U);
  operator-(&local_228,(RectMatrix<double,_3U,_3U> *)&Dtt,&local_270);
  SquareMatrix3<double>::transpose(&local_348,&Dtr);
  operator*((SquareMatrix3<double> *)&local_300,&local_348,&U);
  operator+(&local_5b8,&local_228,&local_300);
  operator*((SquareMatrix3<double> *)&local_390,&U,&Dtr);
  operator-(&local_570,&local_5b8,&local_390);
  RectMatrix<double,_3U,_3U>::operator=(&local_4e0,&local_570);
  SquareMatrix3<double>::operator=(&Dpostt,(SquareMatrix<double,_3> *)&local_4e0);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&Dposrr,(RectMatrix<double,_3U,_3U> *)&Drr);
  operator*((SquareMatrix3<double> *)&local_5b8,(SquareMatrix3<double> *)&Drr,&U);
  operator+(&local_570,(RectMatrix<double,_3U,_3U> *)&Dtr,&local_5b8);
  RectMatrix<double,_3U,_3U>::operator=(&local_4e0,&local_570);
  SquareMatrix3<double>::operator=(&Dpostr,(SquareMatrix<double,_3> *)&local_4e0);
  SquareMatrix<double,_6>::SquareMatrix(__return_storage_ptr__);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)__return_storage_ptr__,0,0,&Dpostt);
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_4e0,&Dpostr);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)__return_storage_ptr__,0,3,
             (SquareMatrix3<double> *)&local_4e0);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)__return_storage_ptr__,3,0,&Dpostr);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)__return_storage_ptr__,3,3,&Dposrr);
  return __return_storage_ptr__;
}

Assistant:

Mat6x6d HydroProp::getDiffusionTensorAtPos(Vector3d pos,
                                             RealType temperature) {
    // Vector from reference point to center of resistance  = cor_
    // Vector from reference point to new location = pos
    // Vector from center of resistance to new location = pos - cor_

    Vector3d cp = pos - cor_;
    Mat3x3d U;
    U.setupSkewMat(cp);

    Mat6x6d D = getDiffusionTensor(temperature);

    Mat3x3d Dtt;
    Mat3x3d Dtr;
    Mat3x3d Drr;

    D.getSubMatrix(0, 0, Dtt);
    D.getSubMatrix(3, 0, Dtr);
    D.getSubMatrix(3, 3, Drr);

    // calculate Diffusion Tensor at new location
    Mat3x3d Dpostt;  // translational diffusion tensor at new location
    Mat3x3d Dpostr;  // rotational diffusion tensor at new location
    Mat3x3d Dposrr;  // translation-rotation coupling diffusion tensor
                     // at new location

    Dpostt = Dtt - U * Drr * U + Dtr.transpose() * U - U * Dtr;
    Dposrr = Drr;
    Dpostr = Dtr + Drr * U;

    Mat6x6d Dpos;
    Dpos.setSubMatrix(0, 0, Dpostt);
    Dpos.setSubMatrix(0, 3, Dpostr.transpose());
    Dpos.setSubMatrix(3, 0, Dpostr);
    Dpos.setSubMatrix(3, 3, Dposrr);
    return Dpos;
  }